

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall libtorrent::utp_socket_impl::send_syn(utp_socket_impl *this)

{
  uint8_t *p_00;
  _Atomic_word *p_Var1;
  ushort uVar2;
  uint uVar3;
  utp_socket_manager *this_00;
  packet *ppVar4;
  uint16_t uVar5;
  uint val;
  long lVar6;
  packet *ppVar7;
  int iVar8;
  char *p_1;
  undefined1 *puVar9;
  uint8_t *puVar10;
  char *p_4;
  packet_ptr p;
  error_code ec;
  packet *local_80;
  packet *local_78;
  _Head_base<0UL,_libtorrent::packet_*,_false> local_70;
  error_code local_68;
  undefined1 local_58 [8];
  weak_ptr<libtorrent::utp_socket_interface> local_50;
  basic_endpoint<boost::asio::ip::udp> local_40;
  
  lVar6 = random((libtorrent *)0xffff);
  uVar5 = (uint16_t)lVar6;
  this->m_seq_nr = uVar5;
  this->m_acked_seq_nr = uVar5 - 1;
  this->m_loss_seq_nr = uVar5 - 1;
  this->m_ack_nr = 0;
  this->m_fast_resend_seq_nr = uVar5;
  packet_pool::alloc((packet_pool *)&local_80,(int)this->m_sm + 0x100);
  ppVar4 = local_80;
  local_80->size = 0x14;
  local_80->header_size = 0x14;
  *(undefined2 *)&local_80->field_0xe = 0x4100;
  p_00 = local_80->buf;
  *(undefined1 *)
   &(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)&local_80[1].send_time.__d)
    ->_M_t).super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
    super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl = 0;
  uVar2 = this->m_recv_id;
  puVar9 = (undefined1 *)
           ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
                    &local_80[1].send_time.__d)->_M_t).
                   super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
                   super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 1);
  iVar8 = 8;
  do {
    *puVar9 = (char)(uVar2 >> ((byte)iVar8 & 0x1f));
    puVar9 = puVar9 + 1;
    iVar8 = iVar8 + -8;
  } while (iVar8 != -8);
  uVar3 = this->m_reply_micro;
  puVar9 = (undefined1 *)
           ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
                    &local_80[1].send_time.__d)->_M_t).
                   super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
                   super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 7);
  iVar8 = 0x18;
  do {
    *puVar9 = (char)(uVar3 >> ((byte)iVar8 & 0x1f));
    puVar9 = puVar9 + 1;
    iVar8 = iVar8 + -8;
  } while (iVar8 != -8);
  *(undefined4 *)((long)&local_80[1].size + 1) = 0;
  uVar2 = this->m_seq_nr;
  puVar10 = local_80[1].buf;
  iVar8 = 8;
  do {
    *puVar10 = (uint8_t)(uVar2 >> ((byte)iVar8 & 0x1f));
    puVar10 = puVar10 + 1;
    iVar8 = iVar8 + -8;
  } while (iVar8 != -8);
  *(undefined2 *)
   ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
            &local_80[2].send_time.__d)->_M_t).
           super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
           super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 1) = 0;
  ppVar7 = (packet *)std::chrono::_V2::system_clock::now();
  (((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)&(local_80->send_time).__d)->
  _M_t).super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
  super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl = ppVar7;
  puVar9 = (undefined1 *)
           ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
                    &ppVar4[1].send_time.__d)->_M_t).
                   super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
                   super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 3);
  iVar8 = 0x18;
  do {
    *puVar9 = (char)((uint)((int)(SUB168(SEXT816((long)ppVar7) * SEXT816(0x20c49ba5e353f7cf),8) >> 7
                                 ) - (SUB164(SEXT816((long)ppVar7) * SEXT816(0x20c49ba5e353f7cf),0xc
                                            ) >> 0x1f)) >> ((byte)iVar8 & 0x1f));
    puVar9 = puVar9 + 1;
    iVar8 = iVar8 + -8;
  } while (iVar8 != -8);
  local_68.val_ = 0;
  local_68._4_4_ = local_68._4_4_ & 0xffffff00;
  local_68.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = this->m_sm;
  local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_sock).super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->m_sock).super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_40,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,&local_50,&local_40,(char *)p_00,0x14,&local_68,(udp_send_flags_t)0x0);
  if (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_50.
                 super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_50.
               super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_50.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((local_68.val_ == 0xb) &&
     (((local_68.cat_)->id_ == 0x8fafd21e25c5e09b || ((local_68.cat_)->id_ == 0x8fafd21e25c5e09b))))
  {
    if ((*(ushort *)&this->field_0x21a >> 0xd & 1) == 0) {
      *(ushort *)&this->field_0x21a = *(ushort *)&this->field_0x21a | 0x2000;
      utp_socket_manager::subscribe_writable(this->m_sm,this);
    }
  }
  else if (local_68.failed_ == true) {
    local_70._M_head_impl = local_80;
    local_80 = (packet *)0x0;
    release_packet(this,(packet_ptr *)&local_70);
    if (local_70._M_head_impl != (packet *)0x0) {
      free(local_70._M_head_impl);
    }
    local_70._M_head_impl = (packet *)0x0;
    (this->m_error).val_ = local_68.val_;
    (this->m_error).failed_ = (bool)local_68.failed_;
    *(int3 *)&(this->m_error).field_0x5 = local_68._5_3_;
    (this->m_error).cat_ = local_68.cat_;
    set_state(this,4);
    test_socket_state(this);
    goto LAB_00328038;
  }
  if ((this->field_0x21b & 0x20) == 0) {
    local_80->field_0xe = local_80->field_0xe & 0xc0 | local_80->field_0xe + 1 & 0x3f;
  }
  local_78 = local_80;
  local_80 = (packet *)0x0;
  packet_buffer::insert
            ((packet_buffer *)local_58,(int)this + 0xc0,(packet_ptr *)(ulong)this->m_seq_nr);
  if ((tuple<std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>[]>_>
       )local_58 !=
      (_Head_base<0UL,_std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>_*,_false>)0x0
     ) {
    free((void *)local_58);
  }
  local_58 = (undefined1  [8])0x0;
  if (local_78 != (packet *)0x0) {
    free(local_78);
  }
  local_78 = (packet *)0x0;
  this->m_seq_nr = this->m_seq_nr + 1;
  set_state(this,1);
LAB_00328038:
  if (local_80 != (packet *)0x0) {
    free(local_80);
  }
  return;
}

Assistant:

void utp_socket_impl::send_syn()
{
	INVARIANT_CHECK;

	m_seq_nr = std::uint16_t(random(0xffff));
	m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
	m_loss_seq_nr = m_acked_seq_nr;
	m_ack_nr = 0;
	m_fast_resend_seq_nr = m_seq_nr;

	packet_ptr p = acquire_packet(sizeof(utp_header));
	p->size = sizeof(utp_header);
	p->header_size = sizeof(utp_header);
	p->num_transmissions = 0;
	p->mtu_probe = false;
#if TORRENT_USE_ASSERTS
	p->num_fast_resend = 0;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	h->type_ver = (ST_SYN << 4) | 1;
	h->extension = utp_no_extension;
	// using recv_id here is intentional! This is an odd
	// thing in uTP. The syn packet is sent with the connection
	// ID that it expects to receive the syn ack on. All
	// subsequent connection IDs will be this plus one.
	h->connection_id = m_recv_id;
	h->timestamp_difference_microseconds = m_reply_micro;
	h->wnd_size = 0;
	h->seq_nr = m_seq_nr;
	h->ack_nr = 0;

	time_point const now = clock_type::now();
	p->send_time = now;
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: send_syn seq_nr:%d id:%d target:%s\n"
		, static_cast<void*>(this), int(m_seq_nr), int(m_recv_id)
		, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str());
#endif

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(h) , sizeof(utp_header), ec);

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		if (!m_stalled)
		{
			m_stalled = true;
			m_sm.subscribe_writable(this);
		}
	}
	else if (ec)
	{
		release_packet(std::move(p));
		m_error = ec;
		set_state(UTP_STATE_ERROR_WAIT);
		test_socket_state();
		return;
	}

	if (!m_stalled)
		++p->num_transmissions;

	TORRENT_ASSERT(!m_outbuf.at(m_seq_nr));
	TORRENT_ASSERT(h->seq_nr == m_seq_nr);
	TORRENT_ASSERT(p->buf == reinterpret_cast<std::uint8_t*>(h));
	m_outbuf.insert(m_seq_nr, std::move(p));

	m_seq_nr = (m_seq_nr + 1) & ACK_MASK;

	TORRENT_ASSERT(!m_error);
	set_state(UTP_STATE_SYN_SENT);
#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif
}